

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log10.c
# Opt level: O2

double c_log10(double x)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int local_14;
  
  iVar1 = isnan(x);
  if (iVar1 == 0) {
    if ((INFINITY != x) || (NAN(INFINITY) || NAN(x))) {
      if (x <= 0.0) {
        if ((x != 0.0) || (NAN(x))) {
          mtherr(fname,1);
          x = NAN;
        }
        else {
          mtherr(fname,2);
          x = -INFINITY;
        }
      }
      else {
        dVar2 = frexp(x,&local_14);
        iVar1 = local_14;
        if (dVar2 < 0.7071067811865476) {
          iVar1 = local_14 + -1;
          dVar2 = ldexp(dVar2,1);
        }
        dVar2 = dVar2 + -1.0;
        dVar3 = polevl(dVar2,P,6);
        dVar4 = p1evl(dVar2,Q,6);
        dVar5 = ldexp(dVar2 * dVar2,-1);
        dVar5 = ((dVar3 * dVar2 * dVar2) / dVar4) * dVar2 - dVar5;
        x = (double)iVar1 * 0.30078125 +
            (double)iVar1 * 0.0002487456639811952 +
            dVar2 * 0.43359375 + dVar5 * 0.43359375 + (dVar2 + dVar5) * 0.0007007319032518276;
      }
    }
  }
  return x;
}

Assistant:

double c_log10(x)
double x;
{
VOLATILE double z;
double y;
#ifdef DEC
short *q;
#endif
int e;

#ifdef NANS
if( isnan(x) )
	return(x);
#endif
#ifdef INFINITIES
if( x == INFINITY )
	return(x);
#endif
/* Test for domain */
if( x <= 0.0 )
	{
	if( x == 0.0 )
	        {
		mtherr( fname, SING );
		return( -INFINITY );
	        }
	else
	        {
		mtherr( fname, DOMAIN );
		return( NAN );
	        }
	}

/* separate mantissa from exponent */

#ifdef DEC
q = (short *)&x;
e = *q;			/* short containing exponent */
e = ((e >> 7) & 0377) - 0200;	/* the exponent */
*q &= 0177;	/* strip exponent from x */
*q |= 040000;	/* x now between 0.5 and 1 */
#endif

#ifdef IBMPC
x = frexp( x, &e );
/*
q = (short *)&x;
q += 3;
e = *q;
e = ((e >> 4) & 0x0fff) - 0x3fe;
*q &= 0x0f;
*q |= 0x3fe0;
*/
#endif

/* Equivalent C language standard library function: */
#ifdef UNK
x = frexp( x, &e );
#endif

#ifdef MIEEE
x = frexp( x, &e );
#endif

/* logarithm using log(1+x) = x - .5x**2 + x**3 P(x)/Q(x) */

if( x < SQRTH )
	{
	e -= 1;
	x = ldexp( x, 1 ) - 1.0; /*  2x - 1  */
	}	
else
	{
	x = x - 1.0;
	}


/* rational form */
z = x*x;
y = x * ( z * polevl( x, P, 6 ) / p1evl( x, Q, 6 ) );
y = y - ldexp( z, -1 );   /*  y - 0.5 * x**2  */

/* multiply log of fraction by log10(e)
 * and base 2 exponent by log10(2)
 */
z = (x + y) * L10EB;  /* accumulate terms in order of size */
z += y * L10EA;
z += x * L10EA;
z += e * L102B;
z += e * L102A;


return( z );
}